

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O2

string * ApprovalTests::HelpMessages::getUnconfiguredRootDirectory_abi_cxx11_(void)

{
  string *in_RDI;
  string helpMessage;
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)&local_30,
             "* Hello from Approval Tests.\n*\n* It looks like your program is calling some code that requires knowledge of\n* the location of the main() in your source tree.\n*\n* To do this, add the following to your main.cpp file:\n*\n*     APPROVAL_TESTS_REGISTER_MAIN_DIRECTORY\n*\n* Currently, this is only required if you are using TemplatedCustomNamer\'s\n* {RelativeTestSourceDirectory}.\n"
             ,&local_31);
  topAndTailHelpMessage(in_RDI,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string HelpMessages::getUnconfiguredRootDirectory()
    {
        std::string helpMessage = R"(* Hello from Approval Tests.
*
* It looks like your program is calling some code that requires knowledge of
* the location of the main() in your source tree.
*
* To do this, add the following to your main.cpp file:
*
*     APPROVAL_TESTS_REGISTER_MAIN_DIRECTORY
*
* Currently, this is only required if you are using TemplatedCustomNamer's
* {RelativeTestSourceDirectory}.
)";
        return topAndTailHelpMessage(helpMessage);
    }